

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O1

bool __thiscall QtPrivate::isRightToLeft(QtPrivate *this,QStringView string)

{
  ushort *puVar1;
  ushort uVar2;
  ushort uVar3;
  Direction DVar4;
  byte unaff_BL;
  char32_t ucs4;
  int iVar5;
  ushort *puVar6;
  ushort *puVar7;
  bool bVar8;
  
  puVar1 = (ushort *)string.m_size + (long)this;
  iVar5 = 0;
  puVar6 = (ushort *)string.m_size;
  do {
    if (puVar1 <= puVar6) {
      unaff_BL = 0;
      break;
    }
    puVar7 = puVar6 + 1;
    uVar2 = *puVar6;
    ucs4 = (char32_t)uVar2;
    if (((((uVar2 & 0xf800) == 0xd800) && (ucs4 = L'�', (uVar2 & 0xdc00) == 0xd800)) &&
        (puVar7 < puVar1)) && (uVar3 = *puVar7, (uVar3 & 0xfc00) == 0xdc00)) {
      puVar7 = puVar6 + 2;
      ucs4 = (uint)uVar2 * 0x400 + (uint)uVar3 + L'\xfca02400';
    }
    DVar4 = QChar::direction(ucs4);
    if ((int)DVar4 < 0x13) {
      if (DVar4 == DirL) {
        if (iVar5 != 0) goto LAB_00338da1;
        iVar5 = 0;
        bVar8 = false;
        unaff_BL = 0;
      }
      else {
        if (((DVar4 != DirR) && (DVar4 != DirAL)) || (iVar5 != 0)) goto LAB_00338da1;
        unaff_BL = 1;
        iVar5 = 0;
        bVar8 = false;
      }
    }
    else {
      if (DVar4 - DirLRI < 3) {
        iVar5 = iVar5 + 1;
      }
      else if ((DVar4 == DirPDI) && (bVar8 = iVar5 == 0, iVar5 = iVar5 + -1, bVar8)) {
        iVar5 = 0;
      }
LAB_00338da1:
      bVar8 = true;
    }
    puVar6 = puVar7;
  } while (bVar8);
  return (bool)(unaff_BL & 1);
}

Assistant:

bool QtPrivate::isRightToLeft(QStringView string) noexcept
{
    int isolateLevel = 0;

    for (QStringIterator i(string); i.hasNext();) {
        const char32_t c = i.next();

        switch (QChar::direction(c)) {
        case QChar::DirRLI:
        case QChar::DirLRI:
        case QChar::DirFSI:
            ++isolateLevel;
            break;
        case QChar::DirPDI:
            if (isolateLevel)
                --isolateLevel;
            break;
        case QChar::DirL:
            if (isolateLevel)
                break;
            return false;
        case QChar::DirR:
        case QChar::DirAL:
            if (isolateLevel)
                break;
            return true;
        case QChar::DirEN:
        case QChar::DirES:
        case QChar::DirET:
        case QChar::DirAN:
        case QChar::DirCS:
        case QChar::DirB:
        case QChar::DirS:
        case QChar::DirWS:
        case QChar::DirON:
        case QChar::DirLRE:
        case QChar::DirLRO:
        case QChar::DirRLE:
        case QChar::DirRLO:
        case QChar::DirPDF:
        case QChar::DirNSM:
        case QChar::DirBN:
            break;
        }
    }
    return false;
}